

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitBuffer.h
# Opt level: O0

bool __thiscall
BitBuffer::read<std::array<unsigned_char,11ul>>(BitBuffer *this,array<unsigned_char,_11UL> *buf)

{
  uint8_t uVar1;
  int iVar2;
  iterator pvVar3;
  value_type *b;
  iterator __end0;
  iterator __begin0;
  array<unsigned_char,_11UL> *__range2;
  bool clean;
  array<unsigned_char,_11UL> *buf_local;
  BitBuffer *this_local;
  
  iVar2 = remaining(this);
  __end0 = std::array<unsigned_char,_11UL>::begin(buf);
  pvVar3 = std::array<unsigned_char,_11UL>::end(buf);
  for (; __end0 != pvVar3; __end0 = __end0 + 1) {
    uVar1 = read_byte(this);
    *__end0 = uVar1;
  }
  return 10 < iVar2;
}

Assistant:

bool read(T& buf)
    {
        static_assert(sizeof(buf[0]) == 1, "unit size must be 1 byte");
        bool clean = remaining() >= static_cast<int>(sizeof(buf));

        for (auto& b : buf)
            b = read_byte();

        return clean;
    }